

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator*(sc_signed *__return_storage_ptr__,sc_signed *u,unsigned_long v)

{
  int iVar1;
  sc_digit vd [3];
  
  iVar1 = u->sgn;
  if (v == 0 || iVar1 == 0) {
    sc_length_param::sc_length_param((sc_length_param *)vd);
    sc_signed::sc_signed(__return_storage_ptr__,vd[0]);
  }
  else {
    from_uint<unsigned_long>(3,vd,v);
    mul_signed_friend(__return_storage_ptr__,(uint)(iVar1 == 1) * 2 + -1,u->nbits,u->ndigits,
                      u->digit,0x40,3,vd);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator*(const sc_signed& u, unsigned long v)
{

  small_type s = mul_signs(u.sgn, get_sign(v));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(v);

  // else cases 2-4
  return mul_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}